

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scd_pcm.c
# Opt level: O0

void SCD_PCM_Reset(void *info)

{
  undefined1 *puVar1;
  pcm_chan_ *chan;
  int i;
  pcm_chip_ *chip;
  void *info_local;
  
  memset(*(void **)((long)info + 0xf8),0,(ulong)*(uint *)((long)info + 0xf4));
  *(undefined1 *)((long)info + 0xd) = 0;
  *(undefined1 *)((long)info + 0xe) = 0;
  *(undefined2 *)((long)info + 0x10) = 0;
  for (chan._4_4_ = 0; chan._4_4_ < 8; chan._4_4_ = chan._4_4_ + 1) {
    puVar1 = (undefined1 *)((long)info + (long)chan._4_4_ * 0x1c + 0x14);
    puVar1[0x16] = 0;
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined2 *)(puVar1 + 6) = 0;
    *(undefined4 *)(puVar1 + 0xc) = 0;
    *(undefined2 *)(puVar1 + 8) = 0;
    *(undefined4 *)(puVar1 + 0x10) = 0;
    *(undefined2 *)(puVar1 + 0x14) = 0;
    puVar1[0x17] = 0;
  }
  return;
}

Assistant:

static void SCD_PCM_Reset(void* info)
{
	struct pcm_chip_ *chip = (struct pcm_chip_ *)info;
	int i;
	struct pcm_chan_* chan;
	
	// Clear the PCM memory.
	memset(chip->RAM, 0x00, chip->RAMSize);
	
	chip->Enable = 0;
	chip->Cur_Chan = 0;
	chip->Bank = 0;
	
	/* clear channel registers */
	for (i = 0; i < 8; i++)
	{
		chan = &chip->Channel[i];
		chan->Enable = 0;
		chan->ENV = 0;
		chan->PAN = 0;
		chan->St_Addr = 0;
		chan->Addr = 0;
		chan->Loop_Addr = 0;
		chan->Step = 0;
		chan->Step_B = 0;
		chan->Data = 0;
	}
}